

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cc
# Opt level: O0

void __thiscall brown::App::appEventHandle(App *this)

{
  int iVar1;
  int local_48 [2];
  SDL_Event event;
  App *this_local;
  
  this->dmousx = 0;
  this->dmousy = 0;
  event._48_8_ = this;
  while (iVar1 = SDL_PollEvent(local_48), iVar1 != 0) {
    if (local_48[0] == 0x100) {
      this->isBreak = true;
    }
    else if (local_48[0] == 0x300) {
      if (event.motion.which == 0x1b) {
        this->isBreak = true;
      }
      if (event.motion.which == 0x40000050) {
        this->keystatus[0xcb] = '\x01';
      }
      if (event.motion.which == 0x4000004f) {
        this->keystatus[0xcd] = '\x01';
      }
    }
    else if (local_48[0] == 0x301) {
      if (event.motion.which == 0x1b) {
        this->isBreak = true;
      }
      if (event.motion.which == 0x40000050) {
        this->keystatus[0xcb] = '\0';
      }
      if (event.motion.which == 0x4000004f) {
        this->keystatus[0xcd] = '\0';
      }
    }
    else if (local_48[0] == 0x400) {
      this->mousx = event.motion.which;
      this->dmousx = event.window.data2 + this->dmousx;
      this->mousy = event.display.data1;
      this->dmousy = event.motion.y + this->dmousy;
    }
    else if (local_48[0] == 0x401) {
      if (event.padding[8] == '\x01') {
        this->bstatus = this->bstatus | 1;
      }
      else if (event.padding[8] == '\x02') {
        this->bstatus = this->bstatus | 4;
      }
      else if (event.padding[8] == '\x03') {
        this->bstatus = this->bstatus | 2;
      }
    }
    else if (local_48[0] == 0x402) {
      if (event.padding[8] == '\x01') {
        this->bstatus = this->bstatus & 0xfffffffe;
      }
      else if (event.padding[8] == '\x02') {
        this->bstatus = this->bstatus & 0xfffffffb;
      }
      else if (event.padding[8] == '\x03') {
        this->bstatus = this->bstatus & 0xfffffffd;
      }
    }
  }
  return;
}

Assistant:

void App::appEventHandle() {
    SDL_Event event;
    dmousx = 0; dmousy = 0;
    while (SDL_PollEvent(&event)) {
        switch (event.type) {
            case SDL_KEYDOWN:
                if (event.key.keysym.sym == SDLK_ESCAPE) {isBreak = 1;}
                if (event.key.keysym.sym == SDLK_LEFT ) {keystatus[0xcb] = 1;}
                if (event.key.keysym.sym == SDLK_RIGHT) {keystatus[0xcd] = 1;}
                break;
            case SDL_KEYUP:
                if (event.key.keysym.sym == SDLK_ESCAPE) {isBreak = 1;}
                if (event.key.keysym.sym == SDLK_LEFT ) {keystatus[0xcb] = 0;}
                if (event.key.keysym.sym == SDLK_RIGHT) {keystatus[0xcd] = 0;}
                break;
            case SDL_MOUSEMOTION:
                mousx = event.motion.x; dmousx += event.motion.xrel;
                mousy = event.motion.y; dmousy += event.motion.yrel;
                break;
            case SDL_MOUSEBUTTONDOWN:
                switch (event.button.button) {
                    case SDL_BUTTON_LEFT:   bstatus |= 1<<0; break;
                    case SDL_BUTTON_RIGHT:  bstatus |= 1<<1; break;
                    case SDL_BUTTON_MIDDLE: bstatus |= 1<<2; break;
                }
                break;
            case SDL_MOUSEBUTTONUP:
                switch (event.button.button) {
                    case SDL_BUTTON_LEFT:   bstatus &= ~(1<<0); break;
                    case SDL_BUTTON_RIGHT:  bstatus &= ~(1<<1); break;
                    case SDL_BUTTON_MIDDLE: bstatus &= ~(1<<2); break;
                }
                break;
            case SDL_QUIT:
                isBreak = true; break;
        }
    }
}